

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O2

bool ImGui::ButtonBehavior
               (ImRect *bb,ImGuiID id,bool *out_hovered,bool *out_held,ImGuiButtonFlags flags)

{
  ImVec2 IVar1;
  ImGuiID IVar2;
  ImGuiWindow *window;
  ImGuiWindow *pIVar3;
  uint uVar4;
  ImGuiContext *pIVar5;
  bool bVar6;
  bool bVar7;
  char cVar8;
  int iVar9;
  ulong uVar10;
  long lVar11;
  ImGuiContext *g;
  byte bVar12;
  uint uVar13;
  bool bVar14;
  bool bVar15;
  ImVec2 IVar16;
  float t1;
  
  pIVar5 = GImGui;
  window = GImGui->CurrentWindow;
  window->WriteAccessed = true;
  if ((flags & 0x4000U) != 0) {
    if (out_hovered != (bool *)0x0) {
      *out_hovered = false;
    }
    if (out_held != (bool *)0x0) {
      *out_held = false;
    }
    if (pIVar5->ActiveId == id) {
      ClearActiveID();
    }
    return false;
  }
  bVar14 = (flags & 7U) == 0;
  uVar4 = (uint)bVar14 + flags + 0x20;
  if ((flags & 0x3f0U) != 0) {
    uVar4 = (uint)bVar14 | flags;
  }
  pIVar3 = pIVar5->HoveredWindow;
  if (((uVar4 >> 0xb & 1) == 0) || (pIVar5->HoveredRootWindow != window->RootWindow)) {
    bVar14 = false;
  }
  else {
    pIVar5->HoveredWindow = window;
    bVar14 = true;
  }
  bVar6 = ItemHoverable(bb,id);
  if (bVar6) {
    bVar12 = 1;
    if (((pIVar5->DragDropActive & 1U) != 0) && ((pIVar5->DragDropPayload).SourceId == id)) {
      bVar12 = ((byte)pIVar5->DragDropSourceFlags & 2) >> 1;
    }
  }
  else {
    bVar12 = 0;
  }
  if ((((uVar4 >> 9 & 1) == 0 || (~pIVar5->DragDropActive & 1U) != 0) ||
      ((pIVar5->DragDropSourceFlags & 4) != 0)) || (bVar6 = IsItemHovered(0x20), !bVar6)) {
LAB_0014e709:
    bVar6 = false;
  }
  else {
    SetHoveredID(id);
    t1 = pIVar5->HoveredIdTimer + 0.0001;
    iVar9 = CalcTypematicRepeatAmount(t1 - (pIVar5->IO).DeltaTime,t1,0.7,0.0);
    if (iVar9 == 0) {
      bVar12 = 1;
      goto LAB_0014e709;
    }
    pIVar5->DragDropHoldJustPressedId = id;
    FocusWindow(window);
    bVar12 = 1;
    bVar6 = true;
  }
  if (bVar14) {
    pIVar5->HoveredWindow = pIVar3;
  }
  if (bVar12 == 1 && (uVar4 >> 0xc & 1) != 0) {
    if (pIVar5->HoveredIdPreviousFrame == 0 || pIVar5->HoveredIdPreviousFrame == id)
    goto LAB_0014e755;
LAB_0014e743:
    bVar14 = false;
  }
  else {
    if (bVar12 == 0) goto LAB_0014e743;
LAB_0014e755:
    if (((uVar4 >> 0x10 & 1) == 0) ||
       ((((pIVar5->IO).KeyCtrl == false && ((pIVar5->IO).KeyShift == false)) &&
        ((pIVar5->IO).KeyAlt == false)))) {
      if ((uVar4 & 1) == 0) {
LAB_0014e773:
        if (((uVar4 & 2) == 0) || ((pIVar5->IO).MouseClicked[1] == false)) {
          if ((uVar4 & 4) == 0) {
            uVar13 = 0xffffffff;
            bVar12 = 1;
          }
          else {
            bVar12 = (pIVar5->IO).MouseClicked[2] ^ 1;
            uVar13 = -(uint)bVar12 | 2;
          }
        }
        else {
          bVar12 = 0;
          uVar13 = 1;
        }
        if ((uVar4 & 1) != 0) goto LAB_0014e7db;
LAB_0014e7f1:
        if (((uVar4 & 2) == 0) || ((pIVar5->IO).MouseReleased[1] == false)) {
          lVar11 = 0xffffffff;
          if ((uVar4 & 4) == 0) {
            cVar8 = '\0';
          }
          else {
            cVar8 = (pIVar5->IO).MouseReleased[2];
            if ((bool)cVar8 != false) {
              lVar11 = 2;
            }
          }
        }
        else {
          cVar8 = '\x01';
          lVar11 = 1;
        }
      }
      else {
        uVar13 = 0;
        bVar12 = 0;
        if ((pIVar5->IO).MouseClicked[0] == false) goto LAB_0014e773;
LAB_0014e7db:
        if ((pIVar5->IO).MouseReleased[0] == false) goto LAB_0014e7f1;
        cVar8 = '\x01';
        lVar11 = 0;
      }
      if ((bVar12 == 0) && (pIVar5->ActiveId != id)) {
        if ((uVar4 & 0x60) != 0) {
          SetActiveID(id,window);
          pIVar5->ActiveIdMouseButton = uVar13;
          if ((uVar4 >> 0x12 & 1) == 0) {
            SetFocusID(id,window);
          }
          FocusWindow(window);
        }
        if (((uVar4 & 0x10) != 0) ||
           (((uVar4 >> 8 & 1) != 0 && ((pIVar5->IO).MouseDoubleClicked[uVar13] == true)))) {
          if ((uVar4 >> 0x11 & 1) == 0) {
            SetActiveID(id,window);
          }
          else {
            ClearActiveID();
          }
          pIVar5->ActiveIdMouseButton = uVar13;
          FocusWindow(window);
          bVar6 = true;
        }
      }
      if (((char)(byte)uVar4 < '\0') && (cVar8 != '\0')) {
        bVar14 = true;
        if (((uVar4 >> 10 & 1) != 0) &&
           (bVar14 = bVar6, (pIVar5->IO).MouseDownDurationPrev[lVar11] < (pIVar5->IO).KeyRepeatDelay
           )) {
          bVar14 = true;
        }
        ClearActiveID();
        bVar6 = bVar14;
      }
      if (((((uVar4 >> 10 & 1) != 0) && (pIVar5->ActiveId == id)) &&
          (0.0 < (pIVar5->IO).MouseDownDuration[pIVar5->ActiveIdMouseButton])) &&
         (bVar14 = IsMouseClicked(pIVar5->ActiveIdMouseButton,true), bVar14)) {
        bVar6 = true;
      }
    }
    bVar14 = true;
    if (bVar6) {
      pIVar5->NavDisableHighlight = true;
      bVar14 = true;
    }
  }
  if (((pIVar5->NavId == id) && (pIVar5->NavDisableHighlight == false)) &&
     (pIVar5->NavDisableMouseHover == true)) {
    IVar2 = pIVar5->ActiveId;
    if (IVar2 == id || IVar2 == 0) {
      if ((uVar4 >> 0x13 & 1) == 0) {
LAB_0014e9a9:
        bVar14 = true;
      }
    }
    else if (((uVar4 >> 0x13 & 1) == 0) && (IVar2 == window->MoveId)) goto LAB_0014e9a9;
  }
  if (pIVar5->NavActivateDownId == id) {
    bVar15 = pIVar5->NavActivateId == id;
    bVar7 = IsNavInputTest(0,(uVar4 >> 9 & 2) + ImGuiInputReadMode_Pressed);
    if (bVar7 || bVar15) {
      bVar6 = true;
    }
    else if (pIVar5->ActiveId != id) goto LAB_0014ea22;
    pIVar5->NavActivateId = id;
    SetActiveID(id,window);
    if ((bVar7 || bVar15) && (uVar4 >> 0x12 & 1) == 0) {
      SetFocusID(id,window);
    }
  }
LAB_0014ea22:
  if (pIVar5->ActiveId != id) {
    bVar7 = false;
    goto LAB_0014eaeb;
  }
  if (pIVar5->ActiveIdSource == ImGuiInputSource_Nav) {
    if (pIVar5->NavActivateDownId != id) {
      ClearActiveID();
    }
LAB_0014ead3:
    bVar7 = false;
  }
  else {
    if (pIVar5->ActiveIdSource != ImGuiInputSource_Mouse) goto LAB_0014ead3;
    if (pIVar5->ActiveIdIsJustActivated == true) {
      IVar1 = (pIVar5->IO).MousePos;
      IVar16.x = IVar1.x - (bb->Min).x;
      IVar16.y = IVar1.y - (bb->Min).y;
      pIVar5->ActiveIdClickOffset = IVar16;
    }
    uVar10 = (ulong)(uint)pIVar5->ActiveIdMouseButton;
    if (4 < uVar10) {
      __assert_fail("mouse_button >= 0 && mouse_button < ImGuiMouseButton_COUNT",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui_widgets.cpp"
                    ,0x26a,
                    "bool ImGui::ButtonBehavior(const ImRect &, ImGuiID, bool *, bool *, ImGuiButtonFlags)"
                   );
    }
    bVar7 = true;
    if ((pIVar5->IO).MouseDown[uVar10] == false) {
      bVar7 = bVar6;
      if ((((uVar4 & 0x40) != 0) || (((byte)uVar4 >> 5 & bVar14) != 0)) &&
         (pIVar5->DragDropActive == false)) {
        if ((uVar4 >> 8 & 1) == 0) {
          cVar8 = '\0';
        }
        else {
          cVar8 = (pIVar5->IO).MouseDownWasDoubleClick[uVar10];
        }
        if ((uVar4 >> 10 & 1) == 0) {
          bVar15 = false;
        }
        else {
          bVar15 = (pIVar5->IO).KeyRepeatDelay <= (pIVar5->IO).MouseDownDurationPrev[uVar10];
        }
        if ((cVar8 == '\0') && (bVar7 = true, bVar15)) {
          bVar7 = bVar6;
        }
      }
      bVar6 = bVar7;
      ClearActiveID();
      bVar7 = false;
    }
    if ((uVar4 >> 0x12 & 1) == 0) {
      pIVar5->NavDisableHighlight = true;
    }
  }
  if (bVar6 != false) {
    pIVar5->ActiveIdHasBeenPressedBefore = true;
  }
LAB_0014eaeb:
  if (out_hovered != (bool *)0x0) {
    *out_hovered = bVar14;
  }
  if (out_held != (bool *)0x0) {
    *out_held = bVar7;
  }
  return bVar6;
}

Assistant:

bool ImGui::ButtonBehavior(const ImRect& bb, ImGuiID id, bool* out_hovered, bool* out_held, ImGuiButtonFlags flags)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = GetCurrentWindow();

    if (flags & ImGuiButtonFlags_Disabled)
    {
        if (out_hovered) *out_hovered = false;
        if (out_held) *out_held = false;
        if (g.ActiveId == id) ClearActiveID();
        return false;
    }

    // Default only reacts to left mouse button
    if ((flags & ImGuiButtonFlags_MouseButtonMask_) == 0)
        flags |= ImGuiButtonFlags_MouseButtonDefault_;

    // Default behavior requires click + release inside bounding box
    if ((flags & ImGuiButtonFlags_PressedOnMask_) == 0)
        flags |= ImGuiButtonFlags_PressedOnDefault_;

    ImGuiWindow* backup_hovered_window = g.HoveredWindow;
    const bool flatten_hovered_children = (flags & ImGuiButtonFlags_FlattenChildren) && g.HoveredRootWindow == window->RootWindow;
    if (flatten_hovered_children)
        g.HoveredWindow = window;

#ifdef IMGUI_ENABLE_TEST_ENGINE
    if (id != 0 && window->DC.LastItemId != id)
        IMGUI_TEST_ENGINE_ITEM_ADD(bb, id);
#endif

    bool pressed = false;
    bool hovered = ItemHoverable(bb, id);

    // Drag source doesn't report as hovered
    if (hovered && g.DragDropActive && g.DragDropPayload.SourceId == id && !(g.DragDropSourceFlags & ImGuiDragDropFlags_SourceNoDisableHover))
        hovered = false;

    // Special mode for Drag and Drop where holding button pressed for a long time while dragging another item triggers the button
    if (g.DragDropActive && (flags & ImGuiButtonFlags_PressedOnDragDropHold) && !(g.DragDropSourceFlags & ImGuiDragDropFlags_SourceNoHoldToOpenOthers))
        if (IsItemHovered(ImGuiHoveredFlags_AllowWhenBlockedByActiveItem))
        {
            const float DRAG_DROP_HOLD_TIMER = 0.70f;
            hovered = true;
            SetHoveredID(id);
            if (CalcTypematicRepeatAmount(g.HoveredIdTimer + 0.0001f - g.IO.DeltaTime, g.HoveredIdTimer + 0.0001f, DRAG_DROP_HOLD_TIMER, 0.00f))
            {
                pressed = true;
                g.DragDropHoldJustPressedId = id;
                FocusWindow(window);
            }
        }

    if (flatten_hovered_children)
        g.HoveredWindow = backup_hovered_window;

    // AllowOverlap mode (rarely used) requires previous frame HoveredId to be null or to match. This allows using patterns where a later submitted widget overlaps a previous one.
    if (hovered && (flags & ImGuiButtonFlags_AllowItemOverlap) && (g.HoveredIdPreviousFrame != id && g.HoveredIdPreviousFrame != 0))
        hovered = false;

    // Mouse handling
    if (hovered)
    {
        if (!(flags & ImGuiButtonFlags_NoKeyModifiers) || (!g.IO.KeyCtrl && !g.IO.KeyShift && !g.IO.KeyAlt))
        {
            // Poll buttons
            int mouse_button_clicked = -1;
            int mouse_button_released = -1;
            if ((flags & ImGuiButtonFlags_MouseButtonLeft) && g.IO.MouseClicked[0])         { mouse_button_clicked = 0; }
            else if ((flags & ImGuiButtonFlags_MouseButtonRight) && g.IO.MouseClicked[1])   { mouse_button_clicked = 1; }
            else if ((flags & ImGuiButtonFlags_MouseButtonMiddle) && g.IO.MouseClicked[2])  { mouse_button_clicked = 2; }
            if ((flags & ImGuiButtonFlags_MouseButtonLeft) && g.IO.MouseReleased[0])        { mouse_button_released = 0; }
            else if ((flags & ImGuiButtonFlags_MouseButtonRight) && g.IO.MouseReleased[1])  { mouse_button_released = 1; }
            else if ((flags & ImGuiButtonFlags_MouseButtonMiddle) && g.IO.MouseReleased[2]) { mouse_button_released = 2; }

            if (mouse_button_clicked != -1 && g.ActiveId != id)
            {
                if (flags & (ImGuiButtonFlags_PressedOnClickRelease | ImGuiButtonFlags_PressedOnClickReleaseAnywhere))
                {
                    SetActiveID(id, window);
                    g.ActiveIdMouseButton = mouse_button_clicked;
                    if (!(flags & ImGuiButtonFlags_NoNavFocus))
                        SetFocusID(id, window);
                    FocusWindow(window);
                }
                if ((flags & ImGuiButtonFlags_PressedOnClick) || ((flags & ImGuiButtonFlags_PressedOnDoubleClick) && g.IO.MouseDoubleClicked[mouse_button_clicked]))
                {
                    pressed = true;
                    if (flags & ImGuiButtonFlags_NoHoldingActiveId)
                        ClearActiveID();
                    else
                        SetActiveID(id, window); // Hold on ID
                    g.ActiveIdMouseButton = mouse_button_clicked;
                    FocusWindow(window);
                }
            }
            if ((flags & ImGuiButtonFlags_PressedOnRelease) && mouse_button_released != -1)
            {
                // Repeat mode trumps on release behavior
                const bool has_repeated_at_least_once = (flags & ImGuiButtonFlags_Repeat) && g.IO.MouseDownDurationPrev[mouse_button_released] >= g.IO.KeyRepeatDelay;
                if (!has_repeated_at_least_once)
                    pressed = true;
                ClearActiveID();
            }

            // 'Repeat' mode acts when held regardless of _PressedOn flags (see table above).
            // Relies on repeat logic of IsMouseClicked() but we may as well do it ourselves if we end up exposing finer RepeatDelay/RepeatRate settings.
            if (g.ActiveId == id && (flags & ImGuiButtonFlags_Repeat))
                if (g.IO.MouseDownDuration[g.ActiveIdMouseButton] > 0.0f && IsMouseClicked(g.ActiveIdMouseButton, true))
                    pressed = true;
        }

        if (pressed)
            g.NavDisableHighlight = true;
    }

    // Gamepad/Keyboard navigation
    // We report navigated item as hovered but we don't set g.HoveredId to not interfere with mouse.
    if (g.NavId == id && !g.NavDisableHighlight && g.NavDisableMouseHover && (g.ActiveId == 0 || g.ActiveId == id || g.ActiveId == window->MoveId))
        if (!(flags & ImGuiButtonFlags_NoHoveredOnFocus))
            hovered = true;
    if (g.NavActivateDownId == id)
    {
        bool nav_activated_by_code = (g.NavActivateId == id);
        bool nav_activated_by_inputs = IsNavInputTest(ImGuiNavInput_Activate, (flags & ImGuiButtonFlags_Repeat) ? ImGuiInputReadMode_Repeat : ImGuiInputReadMode_Pressed);
        if (nav_activated_by_code || nav_activated_by_inputs)
            pressed = true;
        if (nav_activated_by_code || nav_activated_by_inputs || g.ActiveId == id)
        {
            // Set active id so it can be queried by user via IsItemActive(), equivalent of holding the mouse button.
            g.NavActivateId = id; // This is so SetActiveId assign a Nav source
            SetActiveID(id, window);
            if ((nav_activated_by_code || nav_activated_by_inputs) && !(flags & ImGuiButtonFlags_NoNavFocus))
                SetFocusID(id, window);
        }
    }

    // Process while held
    bool held = false;
    if (g.ActiveId == id)
    {
        if (g.ActiveIdSource == ImGuiInputSource_Mouse)
        {
            if (g.ActiveIdIsJustActivated)
                g.ActiveIdClickOffset = g.IO.MousePos - bb.Min;

            const int mouse_button = g.ActiveIdMouseButton;
            IM_ASSERT(mouse_button >= 0 && mouse_button < ImGuiMouseButton_COUNT);
            if (g.IO.MouseDown[mouse_button])
            {
                held = true;
            }
            else
            {
                bool release_in = hovered && (flags & ImGuiButtonFlags_PressedOnClickRelease) != 0;
                bool release_anywhere = (flags & ImGuiButtonFlags_PressedOnClickReleaseAnywhere) != 0;
                if ((release_in || release_anywhere) && !g.DragDropActive)
                {
                    // Report as pressed when releasing the mouse (this is the most common path)
                    bool is_double_click_release = (flags & ImGuiButtonFlags_PressedOnDoubleClick) && g.IO.MouseDownWasDoubleClick[mouse_button];
                    bool is_repeating_already = (flags & ImGuiButtonFlags_Repeat) && g.IO.MouseDownDurationPrev[mouse_button] >= g.IO.KeyRepeatDelay; // Repeat mode trumps <on release>
                    if (!is_double_click_release && !is_repeating_already)
                        pressed = true;
                }
                ClearActiveID();
            }
            if (!(flags & ImGuiButtonFlags_NoNavFocus))
                g.NavDisableHighlight = true;
        }
        else if (g.ActiveIdSource == ImGuiInputSource_Nav)
        {
            // When activated using Nav, we hold on the ActiveID until activation button is released
            if (g.NavActivateDownId != id)
                ClearActiveID();
        }
        if (pressed)
            g.ActiveIdHasBeenPressedBefore = true;
    }

    if (out_hovered) *out_hovered = hovered;
    if (out_held) *out_held = held;

    return pressed;
}